

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

ExecuteResult __thiscall Statement::executeInsert(Statement *this,Table *t)

{
  uint32_t key;
  Cursor *c;
  char *node;
  uint32_t *puVar1;
  
  key = (this->rowToInsert).id;
  c = Table::tableFind(t,key);
  node = Pager::getPage(t->pager,c->pageNum);
  puVar1 = leaf_node_num_cells(node);
  if ((c->cellNum < *puVar1) && (puVar1 = leaf_node_key(node,c->cellNum), *puVar1 == key)) {
    return ExecuteDuplicateKey;
  }
  Table::leafNodeInsert(t,c,(this->rowToInsert).id,&this->rowToInsert);
  operator_delete(c,0x18);
  return ExecuteSucess;
}

Assistant:

ExecuteResult Statement::executeInsert(Table *t) {
	uint32_t keyToInsert = rowToInsert.id;
	Cursor *c = t->tableFind(keyToInsert);

	char *node = t->getPager()->getPage(c->pageNum);
	uint32_t numOfCells = *(leaf_node_num_cells(node));

	if (c->cellNum < numOfCells) {
		uint32_t keyAtIndex = *leaf_node_key(node, c->cellNum);
		if (keyAtIndex == keyToInsert) {
			return ExecuteDuplicateKey;
		}
	}

	t->leafNodeInsert(c, rowToInsert.id, &rowToInsert);
	delete c;

	return ExecuteSucess;
}